

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmpEstimation.cpp
# Opt level: O2

Vector computeZmp(Vector *forces,Matrix *sensorPosition1,Matrix *sensorPosition2,uint contactNbr)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  long lVar29;
  bool bVar30;
  Scalar *pSVar31;
  CoeffReturnType pdVar32;
  Scalar *pSVar33;
  undefined4 in_register_0000000c;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index extraout_RDX_01;
  Index extraout_RDX_02;
  Index IVar34;
  Matrix<double,__1,__1,_0,__1,__1> *src;
  uint in_R8D;
  int iVar35;
  ulong uVar36;
  double dVar37;
  Vector VVar38;
  double local_158;
  double local_138;
  double local_130;
  double local_128;
  void *local_78;
  long local_70;
  Matrix M;
  
  (forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
       (double *)0x0;
  (forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,3);
  iVar35 = 0;
  uVar36 = 0;
  bVar30 = false;
  local_128 = 0.0;
  local_130 = 0.0;
  local_138 = 0.0;
  local_158 = 0.0;
  do {
    if ((ulong)in_R8D * 6 == uVar36) {
      if ((local_158 != 0.0) || (NAN(local_158))) {
        pSVar33 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)forces,0)
        ;
        *pSVar33 = local_138 / local_158;
        pSVar33 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)forces,1)
        ;
        *pSVar33 = local_130 / local_158;
        pSVar33 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)forces,2)
        ;
        *pSVar33 = local_128 / local_158;
        IVar34 = extraout_RDX_01;
      }
      else {
        M.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
             (double *)0x0;
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
                  ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)forces,(Scalar *)&M);
        IVar34 = extraout_RDX_02;
      }
      goto LAB_00103c3a;
    }
    Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false> *)&M,
               (Matrix<double,__1,_1,_0,__1,_1> *)sensorPosition1,uVar36 & 0xffffffff,0,6,1);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,_1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_78,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>_> *)&M
              );
    lVar29 = local_70;
    if (local_70 == 6) {
      M.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      M.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
      M.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&M,4,4);
      src = (Matrix<double,__1,__1,_0,__1,__1> *)CONCAT44(in_register_0000000c,contactNbr);
      if ((iVar35 == 1) || (src = sensorPosition2, iVar35 == 0)) {
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)&M,src);
      }
      pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&M,0,0);
      dVar1 = *pSVar31;
      pdVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)&local_78,0
                          );
      dVar2 = *pdVar32;
      pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&M,0,1);
      dVar3 = *pSVar31;
      pdVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)&local_78,1
                          );
      dVar4 = *pdVar32;
      pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&M,0,2);
      dVar5 = *pSVar31;
      pdVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)&local_78,2
                          );
      dVar6 = *pdVar32;
      pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&M,1,0);
      dVar7 = *pSVar31;
      pdVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)&local_78,0
                          );
      dVar8 = *pdVar32;
      pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&M,1,1);
      dVar9 = *pSVar31;
      pdVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)&local_78,1
                          );
      dVar10 = *pdVar32;
      pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&M,1,2);
      dVar11 = *pSVar31;
      pdVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)&local_78,2
                          );
      dVar12 = *pdVar32;
      pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&M,2,0);
      dVar37 = *pSVar31;
      pdVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)&local_78,0
                          );
      dVar13 = *pdVar32;
      pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&M,2,1);
      dVar14 = *pSVar31;
      pdVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)&local_78,1
                          );
      dVar15 = *pdVar32;
      pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&M,2,2);
      dVar16 = *pSVar31;
      pdVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)&local_78,2
                          );
      dVar37 = dVar16 * *pdVar32 + dVar37 * dVar13 + dVar14 * dVar15;
      if (0.0 < dVar37) {
        pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&M,0,0)
        ;
        dVar13 = *pSVar31;
        pdVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)&local_78
                             ,3);
        dVar14 = *pdVar32;
        pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&M,0,1)
        ;
        dVar15 = *pSVar31;
        pdVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)&local_78
                             ,4);
        dVar16 = *pdVar32;
        pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&M,0,2)
        ;
        dVar17 = *pSVar31;
        pdVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)&local_78
                             ,5);
        dVar18 = *pdVar32;
        pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&M,1,3)
        ;
        dVar19 = *pSVar31;
        pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&M,2,3)
        ;
        dVar20 = *pSVar31;
        pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&M,1,0)
        ;
        dVar21 = *pSVar31;
        pdVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)&local_78
                             ,3);
        dVar22 = *pdVar32;
        pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&M,1,1)
        ;
        dVar23 = *pSVar31;
        pdVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)&local_78
                             ,4);
        dVar24 = *pdVar32;
        pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&M,1,2)
        ;
        dVar25 = *pSVar31;
        pdVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)&local_78
                             ,5);
        dVar26 = *pdVar32;
        pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&M,2,3)
        ;
        dVar27 = *pSVar31;
        pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&M,0,3)
        ;
        dVar28 = *pSVar31;
        pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&M,2,3)
        ;
        local_130 = local_130 +
                    ((dVar19 * dVar37 + dVar17 * dVar18 + dVar13 * dVar14 + dVar15 * dVar16) -
                    (dVar11 * dVar12 + dVar7 * dVar8 + dVar9 * dVar10) * dVar20);
        local_138 = local_138 -
                    ((dVar25 * dVar26 + dVar21 * dVar22 + dVar23 * dVar24 +
                     dVar27 * (dVar5 * dVar6 + dVar1 * dVar2 + dVar3 * dVar4)) - dVar28 * dVar37);
        local_158 = local_158 + dVar37;
        local_128 = local_128 + dVar37 * *pSVar31;
      }
      free(M.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    }
    else {
      M.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)forces,(Scalar *)&M);
      bVar30 = true;
    }
    free(local_78);
    uVar36 = uVar36 + 6;
    iVar35 = iVar35 + 1;
  } while (lVar29 == 6);
  IVar34 = extraout_RDX;
  if (!bVar30) {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::~DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)forces);
    IVar34 = extraout_RDX_00;
  }
LAB_00103c3a:
  VVar38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar34;
  VVar38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)forces;
  return (Vector)VVar38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector computeZmp(Vector & forces, Matrix & sensorPosition1, Matrix & sensorPosition2, unsigned contactNbr)
{
  double fnormal = 0;
  double sumZmpx = 0;
  double sumZmpy = 0;
  double sumZmpz = 0;
  Vector zmp;
  zmp.resize(3);

  for(unsigned int i = 0; i < contactNbr; ++i)
  {
    const Vector & f = forces.block(i * 6, 0, 6, 1);
    // Check that force is of dimension 6
    if(f.size() != 6)
    {
      zmp.fill(0.);
      return zmp;
    }

    Matrix M;
    M.resize(4, 4);
    if(i == 0)
    {
      M = sensorPosition1;
    }
    if(i == 1)
    {
      M = sensorPosition2;
    }

    double fx = M(0, 0) * f(0) + M(0, 1) * f(1) + M(0, 2) * f(2);
    double fy = M(1, 0) * f(0) + M(1, 1) * f(1) + M(1, 2) * f(2);
    double fz = M(2, 0) * f(0) + M(2, 1) * f(1) + M(2, 2) * f(2);

    if(fz > 0)
    {
      double Mx = M(0, 0) * f(3) + M(0, 1) * f(4) + M(0, 2) * f(5) + M(1, 3) * fz - M(2, 3) * fy;
      double My = M(1, 0) * f(3) + M(1, 1) * f(4) + M(1, 2) * f(5) + M(2, 3) * fx - M(0, 3) * fz;
      fnormal += fz;
      sumZmpx -= My;
      sumZmpy += Mx;
      sumZmpz += fz * M(2, 3);
    }
  }
  if(fnormal != 0)
  {
    zmp(0) = sumZmpx / fnormal;
    zmp(1) = sumZmpy / fnormal;
    zmp(2) = sumZmpz / fnormal;
  }
  else
  {
    zmp.fill(0.);
  }
  return zmp;
}